

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GenImageGradientH(Image *__return_storage_ptr__,int width,int height,Color left,Color right)

{
  void *pvVar1;
  undefined1 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  float fVar6;
  float fVar7;
  
  pvVar1 = malloc((long)(height * width) << 2);
  if (0 < width) {
    puVar2 = (undefined1 *)((long)pvVar1 + 3);
    uVar3 = 0;
    do {
      if (0 < height) {
        fVar6 = (float)(int)uVar3 / (float)width;
        fVar7 = 1.0 - fVar6;
        uVar4 = (ulong)(uint)height;
        puVar5 = puVar2;
        do {
          puVar5[-3] = (char)(int)((float)((uint)right & 0xff) * fVar6 +
                                  fVar7 * (float)((uint)left & 0xff));
          puVar5[-2] = (char)(int)((float)((uint)right >> 8 & 0xff) * fVar6 +
                                  fVar7 * (float)((uint)left >> 8 & 0xff));
          puVar5[-1] = (char)(int)((float)((uint)right >> 0x10 & 0xff) * fVar6 +
                                  fVar7 * (float)((uint)left >> 0x10 & 0xff));
          *puVar5 = (char)(int)(fVar6 * (float)((uint)right >> 0x18) +
                               fVar7 * (float)((uint)left >> 0x18));
          puVar5 = puVar5 + (ulong)(uint)width * 4;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = uVar3 + 1;
      puVar2 = puVar2 + 4;
    } while (uVar3 != (uint)width);
  }
  __return_storage_ptr__->data = pvVar1;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientH(int width, int height, Color left, Color right)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int i = 0; i < width; i++)
    {
        float factor = (float)i/(float)width;
        for (int j = 0; j < height; j++)
        {
            pixels[j*width + i].r = (int)((float)right.r*factor + (float)left.r*(1.f - factor));
            pixels[j*width + i].g = (int)((float)right.g*factor + (float)left.g*(1.f - factor));
            pixels[j*width + i].b = (int)((float)right.b*factor + (float)left.b*(1.f - factor));
            pixels[j*width + i].a = (int)((float)right.a*factor + (float)left.a*(1.f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}